

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assertions.hpp
# Opt level: O1

void rc::detail::
     doAssert<rc::detail::expr::Eq<rc::detail::expr::Value<std::__cxx11::string>,std::__cxx11::string>>
               (Eq<rc::detail::expr::Value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *expression,bool expectedResult,Type type,string *file,int line,string *assertion)

{
  ValueType VVar1;
  CaseResult *this;
  ostringstream ss;
  string sStack_1e8;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  VVar1 = expr::
          Eq<rc::detail::expr::Value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::value(expression);
  if (VVar1 == expectedResult) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  expr::
  Eq<rc::detail::expr::Value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::show(expression,(ostream *)local_1a8);
  this = (CaseResult *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  makeExpressionMessage(&local_1c8,file,line,assertion,&sStack_1e8);
  CaseResult::CaseResult(this,type,&local_1c8);
  __cxa_throw(this,&CaseResult::typeinfo,CaseResult::~CaseResult);
}

Assistant:

void doAssert(const Expression &expression,
              bool expectedResult,
              CaseResult::Type type,
              const std::string &file,
              int line,
              const std::string &assertion) {
  if (static_cast<bool>(expression.value()) != expectedResult) {
    std::ostringstream ss;
    expression.show(ss);
    throw CaseResult(type,
                     makeExpressionMessage(file, line, assertion, ss.str()));
  }
}